

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O2

void CB_ADF::save_load(cb_adf *c,io_buf *model_file,bool read,bool text)

{
  bool bVar1;
  ostream *poVar2;
  stringstream msg;
  ostream local_1a0;
  
  bVar1 = version_struct::operator<(&c->all->model_file_ver,"8.3.2");
  if (!bVar1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    poVar2 = std::operator<<(&local_1a0,"event_sum ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"\n");
    bin_text_read_write_fixed(model_file,(char *)&(c->gen_cs).event_sum,8,"",read,&msg,text);
    poVar2 = std::operator<<(&local_1a0,"action_sum ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"\n");
    bin_text_read_write_fixed(model_file,(char *)&(c->gen_cs).action_sum,8,"",read,&msg,text);
    std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
  }
  return;
}

Assistant:

void save_load(cb_adf& c, io_buf& model_file, bool read, bool text)
{
  if (c.all->model_file_ver < VERSION_FILE_WITH_CB_ADF_SAVE)
    return;
  stringstream msg;
  msg << "event_sum " << c.gen_cs.event_sum << "\n";
  bin_text_read_write_fixed(model_file, (char*)&c.gen_cs.event_sum, sizeof(c.gen_cs.event_sum), "", read, msg, text);

  msg << "action_sum " << c.gen_cs.action_sum << "\n";
  bin_text_read_write_fixed(model_file, (char*)&c.gen_cs.action_sum, sizeof(c.gen_cs.action_sum), "", read, msg, text);
}